

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::compute_quant_table(jpeg_encoder *this,int32 *pDst,int16 *pSrc)

{
  int local_3c;
  int local_38;
  int local_34;
  int32 j;
  int i;
  int32 q;
  int16 *pSrc_local;
  int32 *pDst_local;
  jpeg_encoder *this_local;
  
  if ((this->m_params).m_quality < 0x32) {
    q = (int32)(5000 / (long)(this->m_params).m_quality);
  }
  else {
    q = (this->m_params).m_quality * -2 + 200;
  }
  pSrc_local = pSrc;
  pDst_local = pDst;
  for (i = 0; i < 0x40; i = i + 1) {
    local_38 = (int)(((long)(*pSrc_local * q) + 0x32) / 100);
    local_34 = local_38;
    if (local_38 < 2) {
      local_34 = 1;
    }
    if (local_34 < 0xff) {
      if (local_38 < 2) {
        local_38 = 1;
      }
      local_3c = local_38;
    }
    else {
      local_3c = 0xff;
    }
    *pDst_local = local_3c;
    pSrc_local = pSrc_local + 1;
    pDst_local = pDst_local + 1;
  }
  return;
}

Assistant:

void jpeg_encoder::compute_quant_table(int32* pDst, int16* pSrc) {
  int32 q;
  if (m_params.m_quality < 50)
    q = 5000 / m_params.m_quality;
  else
    q = 200 - m_params.m_quality * 2;
  for (int i = 0; i < 64; i++) {
    int32 j = *pSrc++;
    j = (j * q + 50L) / 100L;
    *pDst++ = JPGE_MIN(JPGE_MAX(j, 1), 255);
  }
}